

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

int __thiscall
TPZFMatrix<long_double>::Redim(TPZFMatrix<long_double> *this,int64_t newRows,int64_t newCols)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int64_t size;
  int64_t newsize;
  char *in_stack_00000178;
  char *in_stack_00000180;
  
  uVar2 = in_RSI * in_RDX;
  if (uVar2 == in_RDI[1] * in_RDI[2]) {
    in_RDI[1] = in_RSI;
    in_RDI[2] = in_RDX;
    (**(code **)(*in_RDI + 0x78))();
  }
  else {
    if (((in_RDI[4] != 0) && (in_RDI[4] != in_RDI[5])) && ((void *)in_RDI[4] != (void *)0x0)) {
      operator_delete__((void *)in_RDI[4]);
    }
    if ((in_RDI[5] == 0) || (in_RDI[6] < (long)uVar2)) {
      if (uVar2 == 0) {
        in_RDI[4] = 0;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        pvVar4 = operator_new__(uVar3);
        in_RDI[4] = (long)pvVar4;
      }
    }
    else {
      in_RDI[4] = in_RDI[5];
    }
    if ((uVar2 != 0) && (in_RDI[4] == 0)) {
      Error(in_stack_00000180,in_stack_00000178);
    }
    in_RDI[1] = in_RSI;
    in_RDI[2] = in_RDX;
    (**(code **)(*in_RDI + 0x78))();
  }
  return 1;
}

Assistant:

inline int TPZFMatrix<TVar>::Redim(const int64_t newRows,const int64_t newCols) {
    int64_t newsize = newRows*newCols;
    int64_t size = this->fRow*this->fCol;
    if ( newsize == size) {
        this->fRow = newRows;
        this->fCol = newCols;
        Zero();
        return( 1 );
    }
    if(this->fElem && this->fElem != this->fGiven) delete []this->fElem;
    
    if(this->fGiven && newsize <= this->fSize) {
        this->fElem = this->fGiven;
    } else if(newsize == 0) {
        this->fElem = NULL;
    } else {
        this->fElem = new TVar[ newsize ] ;
    }
#ifndef PZNODEBUG
    if (newsize && this->fElem == NULL )
        Error( "Resize <memory allocation error>." );
#endif
    
    this->fRow  = newRows;
    this->fCol  = newCols;
    
    Zero();
    
    return( 1 );
}